

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5UnicodeDelete(Fts5Tokenizer *pTok)

{
  long in_RDI;
  Unicode61Tokenizer *p;
  
  if (in_RDI != 0) {
    sqlite3_free((void *)0x28f5f0);
    sqlite3_free((void *)0x28f601);
    sqlite3_free((void *)0x28f60b);
  }
  return;
}

Assistant:

static void fts5UnicodeDelete(Fts5Tokenizer *pTok){
  if( pTok ){
    Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTok;
    sqlite3_free(p->aiException);
    sqlite3_free(p->aFold);
    sqlite3_free(p);
  }
  return;
}